

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

void __thiscall
cli::Parser::CmdBase::CmdBase
          (CmdBase *this,string *name,string *alternative,string *description,bool required,
          bool dominant,bool variadic)

{
  allocator_type local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  string *local_40;
  string *local_38;
  
  this->_vptr_CmdBase = (_func_int **)&PTR__CmdBase_00127b10;
  local_38 = &this->name;
  std::__cxx11::string::string((string *)local_38,name);
  local_40 = &this->command;
  if (name->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"",&local_41);
  }
  else {
    std::operator+(local_40,"-",name);
  }
  if (alternative->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&this->alternative,"",&local_42);
  }
  else {
    std::operator+(&this->alternative,"--",alternative);
  }
  std::__cxx11::string::string((string *)&this->description,description);
  this->required = required;
  this->handled = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->arguments,
           (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )ZEXT816(0),&local_43);
  this->dominant = dominant;
  this->variadic = variadic;
  return;
}

Assistant:

explicit CmdBase(const std::string& name, const std::string& alternative, const std::string& description, bool required, bool dominant, bool variadic) :
				name(name),
				command(name.size() > 0 ? "-" + name : ""),
				alternative(alternative.size() > 0 ? "--" + alternative : ""),
				description(description),
				required(required),
				handled(false),
				arguments({}),
				dominant(dominant),
				variadic(variadic) {
			}